

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_mul_internal(mp_int *r,mp_int *a,mp_int *b,mp_int scratch)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int scratch_02;
  ulong uVar7;
  mp_int *r_00;
  ulong *puVar8;
  ulong len;
  ulong *puVar9;
  ulong uVar10;
  BignumInt *rp;
  ulong *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  BignumInt *bp;
  ulong *puVar15;
  mp_int r1;
  mp_int b1;
  mp_int a1;
  mp_int r2;
  mp_int b0;
  mp_int a0;
  mp_int asum;
  mp_int r0;
  mp_int product;
  mp_int bsum;
  mp_int local_e0;
  mp_int local_d0;
  mp_int local_c0;
  mp_int local_b0;
  mp_int local_a0;
  mp_int local_90;
  mp_int local_80;
  mp_int local_70;
  mp_int local_60;
  mp_int local_50;
  mp_int local_40;
  
  local_b0.w = scratch.w;
  local_b0.nw = scratch.nw;
  uVar12 = b->nw;
  if (b->nw < a->nw) {
    uVar12 = a->nw;
  }
  if (r->nw < uVar12) {
    uVar12 = r->nw;
  }
  if (uVar12 * 6 < local_b0.nw || uVar12 * 6 - local_b0.nw == 0) {
    mp_clear(r);
    uVar13 = a->nw;
    if (uVar12 < 0x18) {
      uVar7 = b->nw;
    }
    else {
      uVar7 = b->nw;
      if (uVar13 != 0) {
        if (uVar7 != 0) {
          uVar10 = uVar12 >> 1;
          uVar14 = uVar12 - uVar10;
          local_80.nw = uVar14;
          if (uVar13 < uVar14) {
            local_80.nw = uVar13;
          }
          local_80.w = a->w;
          local_90.nw = uVar14;
          if (uVar7 < uVar14) {
            local_90.nw = uVar7;
          }
          local_90.w = b->w;
          local_c0.nw = uVar13 - local_80.nw;
          if (uVar10 <= uVar13 - local_80.nw) {
            local_c0.nw = uVar10;
          }
          local_c0.w = local_80.w + local_80.nw;
          local_d0.nw = uVar7 - local_90.nw;
          if (uVar10 <= uVar7 - local_90.nw) {
            local_d0.nw = uVar10;
          }
          local_d0.w = local_90.w + local_90.nw;
          uVar7 = uVar14 * 2;
          uVar13 = r->nw;
          local_60.w = r->w;
          local_60.nw = uVar7;
          if (uVar13 < uVar7) {
            local_60.nw = uVar13;
          }
          uVar10 = uVar14;
          if (uVar13 < uVar14) {
            uVar10 = uVar13;
          }
          len = uVar13 - uVar10;
          if (uVar13 <= uVar13 - uVar10) {
            len = uVar13;
          }
          local_e0.w = local_60.w + uVar10;
          local_a0.nw = uVar13 - local_60.nw;
          if (uVar13 <= uVar13 - local_60.nw) {
            local_a0.nw = uVar13;
          }
          local_a0.w = local_60.w + local_60.nw;
          local_e0.nw = len;
          mp_mul_internal(&local_60,&local_80,&local_90,scratch);
          mp_mul_internal(&local_a0,&local_c0,&local_d0,scratch);
          if (r->nw < uVar12 * 2) {
            if (uVar12 < len) {
              len = uVar12;
            }
            local_70 = mp_alloc_from_scratch(&local_b0,len);
            r_00 = &local_70;
            scratch_01.w = local_b0.w;
            scratch_01.nw = local_b0.nw;
            scratch_00.w = local_b0.w;
            scratch_00.nw = local_b0.nw;
            mp_mul_internal(r_00,&local_80,&local_d0,scratch_00);
            mp_add_into_internal(&local_e0,&local_e0,r_00);
            mp_mul_internal(r_00,&local_c0,&local_90,scratch_01);
          }
          else {
            local_70 = mp_alloc_from_scratch(&local_b0,uVar14 + 1);
            local_40 = mp_alloc_from_scratch(&local_b0,uVar14 + 1);
            mp_add_into_internal(&local_70,&local_80,&local_c0);
            mp_add_into_internal(&local_40,&local_90,&local_d0);
            local_50 = mp_alloc_from_scratch(&local_b0,uVar7 | 1);
            r_00 = &local_50;
            scratch_02.w = local_b0.w;
            scratch_02.nw = local_b0.nw;
            mp_mul_internal(r_00,&local_70,&local_40,scratch_02);
            mp_sub_into(r_00,r_00,&local_60);
            mp_sub_into(r_00,r_00,&local_a0);
          }
          mp_add_into_internal(&local_e0,&local_e0,r_00);
          return;
        }
        uVar7 = 0;
      }
    }
    puVar9 = a->w;
    puVar1 = puVar9 + uVar13;
    puVar3 = b->w;
    puVar11 = r->w;
    puVar2 = puVar11 + r->nw;
    for (; (puVar9 < puVar1 && (puVar11 < puVar2)); puVar11 = puVar11 + 1) {
      uVar12 = *puVar9;
      uVar13 = 0;
      puVar15 = puVar3;
      for (puVar8 = puVar11; (puVar15 < puVar3 + uVar7 && (puVar8 < puVar2)); puVar8 = puVar8 + 1) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar12;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *puVar15;
        auVar6[8] = CARRY8(uVar13,*puVar8);
        auVar6._0_8_ = uVar13 + *puVar8;
        auVar6._9_7_ = 0;
        auVar6 = auVar4 * auVar5 + auVar6;
        uVar13 = auVar6._8_8_;
        *puVar8 = auVar6._0_8_;
        puVar15 = puVar15 + 1;
      }
      for (; puVar8 < puVar2; puVar8 = puVar8 + 1) {
        uVar12 = *puVar8;
        *puVar8 = *puVar8 + uVar13;
        uVar13 = (ulong)CARRY8(uVar12,uVar13);
      }
      puVar9 = puVar9 + 1;
    }
    return;
  }
  __assert_fail("scratch.nw >= mp_mul_scratchspace_unary(inlen)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x3f7,"void mp_mul_internal(mp_int *, mp_int *, mp_int *, mp_int)");
}

Assistant:

static void mp_mul_internal(mp_int *r, mp_int *a, mp_int *b, mp_int scratch)
{
    size_t inlen = size_t_min(r->nw, size_t_max(a->nw, b->nw));
    assert(scratch.nw >= mp_mul_scratchspace_unary(inlen));

    mp_clear(r);

    if (inlen < KARATSUBA_THRESHOLD || a->nw == 0 || b->nw == 0) {
        /*
         * The input numbers are too small to bother optimising. Go
         * straight to the simple primitive approach.
         */
        mp_mul_add_simple(r, a, b);
        return;
    }

    /*
     * Karatsuba divide-and-conquer algorithm. We cut each input in
     * half, so that it's expressed as two big 'digits' in a giant
     * base D:
     *
     *   a = a_1 D + a_0
     *   b = b_1 D + b_0
     *
     * Then the product is of course
     *
     *   ab = a_1 b_1 D^2 + (a_1 b_0 + a_0 b_1) D + a_0 b_0
     *
     * and we compute the three coefficients by recursively calling
     * ourself to do half-length multiplications.
     *
     * The clever bit that makes this worth doing is that we only need
     * _one_ half-length multiplication for the central coefficient
     * rather than the two that it obviouly looks like, because we can
     * use a single multiplication to compute
     *
     *   (a_1 + a_0) (b_1 + b_0) = a_1 b_1 + a_1 b_0 + a_0 b_1 + a_0 b_0
     *
     * and then we subtract the other two coefficients (a_1 b_1 and
     * a_0 b_0) which we were computing anyway.
     *
     * Hence we get to multiply two numbers of length N in about three
     * times as much work as it takes to multiply numbers of length
     * N/2, which is obviously better than the four times as much work
     * it would take if we just did a long conventional multiply.
     */

    /* Break up the input as botlen + toplen, with botlen >= toplen.
     * The 'base' D is equal to 2^{botlen * BIGNUM_INT_BITS}. */
    size_t toplen = inlen / 2;
    size_t botlen = inlen - toplen;

    /* Alias bignums that address the two halves of a,b, and useful
     * pieces of r. */
    mp_int a0 = mp_make_alias(a, 0, botlen);
    mp_int b0 = mp_make_alias(b, 0, botlen);
    mp_int a1 = mp_make_alias(a, botlen, toplen);
    mp_int b1 = mp_make_alias(b, botlen, toplen);
    mp_int r0 = mp_make_alias(r, 0, botlen*2);
    mp_int r1 = mp_make_alias(r, botlen, r->nw);
    mp_int r2 = mp_make_alias(r, botlen*2, r->nw);

    /* Recurse to compute a0*b0 and a1*b1, in their correct positions
     * in the output bignum. They can't overlap. */
    mp_mul_internal(&r0, &a0, &b0, scratch);
    mp_mul_internal(&r2, &a1, &b1, scratch);

    if (r->nw < inlen*2) {
        /*
         * The output buffer isn't large enough to require the whole
         * product, so some of a1*b1 won't have been stored. In that
         * case we won't try to do the full Karatsuba optimisation;
         * we'll just recurse again to compute a0*b1 and a1*b0 - or at
         * least as much of them as the output buffer size requires -
         * and add each one in.
         */
        mp_int s = mp_alloc_from_scratch(
            &scratch, size_t_min(botlen+toplen, r1.nw));

        mp_mul_internal(&s, &a0, &b1, scratch);
        mp_add_into(&r1, &r1, &s);
        mp_mul_internal(&s, &a1, &b0, scratch);
        mp_add_into(&r1, &r1, &s);
        return;
    }

    /* a0+a1 and b0+b1 */
    mp_int asum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_int bsum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_add_into(&asum, &a0, &a1);
    mp_add_into(&bsum, &b0, &b1);

    /* Their product */
    mp_int product = mp_alloc_from_scratch(&scratch, botlen*2+1);
    mp_mul_internal(&product, &asum, &bsum, scratch);

    /* Subtract off the outer terms we already have */
    mp_sub_into(&product, &product, &r0);
    mp_sub_into(&product, &product, &r2);

    /* And add it in with the right offset. */
    mp_add_into(&r1, &r1, &product);
}